

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rewrite.h
# Opt level: O0

void __thiscall trieste::detail::NegPred::NegPred(NegPred *this,PatternPtr *pattern_)

{
  bool bVar1;
  element_type *this_00;
  runtime_error *this_01;
  PatternPtr *pattern__local;
  NegPred *this_local;
  
  PatternDef::PatternDef(&this->super_PatternDef);
  (this->super_PatternDef)._vptr_PatternDef = (_func_int **)&PTR__NegPred_0049c1d8;
  std::shared_ptr<trieste::detail::PatternDef>::shared_ptr(&this->pattern,pattern_);
  this_00 = std::
            __shared_ptr_access<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&this->pattern);
  bVar1 = PatternDef::has_captures(this_00);
  if (!bVar1) {
    return;
  }
  this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_01,"Captures not allowed inside NegPred (--Pattern)!");
  __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

NegPred(PatternPtr pattern_) : pattern(pattern_)
      {
        if (pattern->has_captures())
          throw std::runtime_error(
            "Captures not allowed inside NegPred (--Pattern)!");
      }